

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O2

int yaml_emitter_emit(yaml_emitter_t *emitter,yaml_event_t *event)

{
  yaml_event_t **tail;
  int *piVar1;
  int *piVar2;
  int *piVar3;
  yaml_emitter_state_t **top;
  yaml_emitter_state_t **end;
  yaml_event_type_t yVar4;
  yaml_event_t *pyVar5;
  byte *pbVar6;
  size_t sVar7;
  yaml_tag_directive_t *pyVar8;
  bool bVar9;
  bool bVar10;
  undefined4 uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  yaml_encoding_t yVar15;
  byte *pbVar16;
  int *piVar17;
  yaml_emitter_state_t *pyVar18;
  yaml_char_t *pyVar19;
  char *pcVar20;
  long lVar21;
  byte *pbVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  int iVar26;
  yaml_event_t *pyVar27;
  bool bVar28;
  bool bVar29;
  int iVar30;
  yaml_event_t *pyVar31;
  byte bVar32;
  ulong uVar33;
  byte bVar34;
  uint uVar35;
  bool bVar36;
  bool bVar37;
  byte bVar38;
  long lStack_b0;
  int local_a4;
  int local_a0;
  int local_7c;
  
  bVar38 = 0;
  pyVar31 = (emitter->events).tail;
  if (pyVar31 == (emitter->events).end) {
    tail = &(emitter->events).tail;
    iVar12 = yaml_queue_extend(&(emitter->events).start,&(emitter->events).head,tail,
                               &(emitter->events).end);
    if (iVar12 == 0) {
      emitter->error = YAML_MEMORY_ERROR;
      yaml_event_delete(event);
      return 0;
    }
    pyVar31 = *tail;
  }
  (emitter->events).tail = pyVar31 + 1;
  for (lVar21 = 0xd; lVar21 != 0; lVar21 = lVar21 + -1) {
    uVar11 = *(undefined4 *)&event->field_0x4;
    pyVar31->type = event->type;
    *(undefined4 *)&pyVar31->field_0x4 = uVar11;
    event = (yaml_event_t *)((long)event + (ulong)bVar38 * -0x10 + 8);
    pyVar31 = (yaml_event_t *)((long)pyVar31 + (ulong)bVar38 * -0x10 + 8);
  }
  piVar1 = &(emitter->scalar_data).flow_plain_allowed;
  piVar2 = &(emitter->scalar_data).block_plain_allowed;
  piVar3 = &(emitter->scalar_data).block_allowed;
  top = &(emitter->states).top;
  end = &(emitter->states).end;
LAB_00104d39:
  pyVar31 = (emitter->events).head;
  pyVar5 = (emitter->events).tail;
  iVar14 = 1;
  iVar12 = 1;
  if (pyVar31 == pyVar5) {
    return 1;
  }
  yVar4 = pyVar31->type;
  lStack_b0 = 1;
  if (yVar4 == YAML_DOCUMENT_START_EVENT) {
LAB_00104d78:
    if (((long)pyVar5 - (long)pyVar31) / 0x68 <= lStack_b0) {
      iVar13 = 0;
      pyVar27 = pyVar31;
      do {
        if (pyVar27 == pyVar5) {
          return 1;
        }
        yVar4 = pyVar27->type;
        if (yVar4 < (YAML_MAPPING_END_EVENT|YAML_STREAM_START_EVENT)) {
          if ((0x28aU >> (yVar4 & 0x1f) & 1) == 0) {
            if ((0x514U >> (yVar4 & 0x1f) & 1) != 0) {
              iVar13 = iVar13 + -1;
            }
          }
          else {
            iVar13 = iVar13 + 1;
          }
        }
        pyVar27 = pyVar27 + 1;
      } while (iVar13 != 0);
    }
  }
  else {
    if (yVar4 == YAML_MAPPING_START_EVENT) {
      lStack_b0 = 3;
      goto LAB_00104d78;
    }
    if (yVar4 == YAML_SEQUENCE_START_EVENT) {
      lStack_b0 = 2;
      goto LAB_00104d78;
    }
  }
  (emitter->anchor_data).anchor = (yaml_char_t *)0x0;
  (emitter->anchor_data).anchor_length = 0;
  (emitter->scalar_data).value = (yaml_char_t *)0x0;
  (emitter->scalar_data).length = 0;
  (emitter->tag_data).suffix = (yaml_char_t *)0x0;
  (emitter->tag_data).suffix_length = 0;
  (emitter->tag_data).handle = (yaml_char_t *)0x0;
  (emitter->tag_data).handle_length = 0;
  switch(pyVar31->type) {
  case YAML_ALIAS_EVENT:
    iVar14 = yaml_emitter_analyze_anchor(emitter,(pyVar31->data).scalar.anchor,1);
LAB_00104e39:
    if (iVar14 == 0) {
      return 0;
    }
    break;
  case YAML_SCALAR_EVENT:
    pyVar19 = (pyVar31->data).scalar.anchor;
    if ((pyVar19 != (yaml_char_t *)0x0) &&
       (iVar13 = yaml_emitter_analyze_anchor(emitter,pyVar19,0), iVar13 == 0)) {
      return 0;
    }
    pyVar19 = (pyVar31->data).scalar.tag;
    if ((pyVar19 != (yaml_char_t *)0x0) &&
       (((emitter->canonical != 0 ||
         (((pyVar31->data).scalar.plain_implicit == 0 &&
          ((pyVar31->data).scalar.quoted_implicit == 0)))) &&
        (iVar13 = yaml_emitter_analyze_tag(emitter,pyVar19), iVar13 == 0)))) {
      return 0;
    }
    pbVar6 = (pyVar31->data).scalar.value;
    sVar7 = (pyVar31->data).scalar.length;
    (emitter->scalar_data).value = pbVar6;
    (emitter->scalar_data).length = sVar7;
    if (sVar7 != 0) {
      bVar38 = *pbVar6;
      if (bVar38 == 0x2e) {
        iVar13 = 0;
        if ((pbVar6[1] == 0x2e) && (pbVar6[2] == 0x2e)) {
LAB_00104f0a:
          iVar13 = 1;
        }
LAB_00104f19:
        bVar36 = true;
        lStack_b0 = 1;
      }
      else {
        if (bVar38 == 0x2d) {
          iVar13 = 0;
          if ((pbVar6[1] == 0x2d) && (pbVar6[2] == 0x2d)) goto LAB_00104f0a;
          goto LAB_00104f19;
        }
        if (-1 < (char)bVar38) {
          iVar13 = 0;
          goto LAB_00104f19;
        }
        bVar36 = false;
        iVar13 = 0;
        lStack_b0 = 2;
        if ((bVar38 & 0xe0) != 0xc0) {
          bVar36 = false;
          lStack_b0 = 3;
          if ((bVar38 & 0xf0) != 0xe0) {
            lStack_b0 = (ulong)((bVar38 & 0xf8) == 0xf0) << 2;
            bVar36 = false;
            iVar13 = 0;
          }
        }
      }
      bVar37 = true;
      if (pbVar6[lStack_b0] == 0x20) goto LAB_001051af;
      if (bVar36) {
        bVar32 = pbVar6[1];
        if ((bVar32 < 0xe) && (bVar37 = true, (0x2600U >> (bVar32 & 0x1f) & 1) != 0))
        goto LAB_001051af;
        if (bVar32 == 0xc2) {
          lVar21 = 1;
          bVar37 = true;
          if (pbVar6[2] == 0x85) goto LAB_001051af;
        }
        else {
          lVar21 = 1;
        }
      }
      else {
        bVar32 = bVar38 & 0xe0;
        if (bVar32 == 0xc0) {
          bVar34 = pbVar6[2];
          if ((bVar34 < 0xe) && (bVar37 = true, (0x2600U >> (bVar34 & 0x1f) & 1) != 0))
          goto LAB_001051af;
          if (bVar34 == 0xc2) {
            bVar34 = pbVar6[3];
LAB_00105165:
            bVar37 = true;
            if (bVar34 == 0x85) goto LAB_001051af;
            goto LAB_0010516a;
          }
          if (bVar34 != 0xe2) goto LAB_0010516a;
LAB_001050b6:
          if (bVar32 == 0xc0) {
            lVar21 = 2;
            goto LAB_001051a3;
          }
        }
        else {
          lVar21 = (ulong)((bVar38 & 0xf8) == 0xf0) << 2;
          if ((bVar38 & 0xf0) == 0xe0) {
            lVar21 = 3;
          }
          bVar34 = pbVar6[lVar21];
          if ((bVar34 < 0xe) && (bVar37 = true, (0x2600U >> (bVar34 & 0x1f) & 1) != 0))
          goto LAB_001051af;
          if (bVar34 == 0xc2) {
            lVar21 = (ulong)((bVar38 & 0xf8) == 0xf0) * 4 + 1;
            if ((bVar38 & 0xf0) == 0xe0) {
              lVar21 = 4;
            }
            bVar34 = pbVar6[lVar21];
            goto LAB_00105165;
          }
          if (bVar34 == 0xe2) goto LAB_001050b6;
LAB_0010516a:
          lVar21 = 2;
          if (bVar32 == 0xc0) goto LAB_001051a3;
        }
        lVar21 = 3;
        if ((bVar38 & 0xf0) != 0xe0) {
          lVar21 = (ulong)((bVar38 & 0xf8) == 0xf0) << 2;
        }
      }
LAB_001051a3:
      bVar37 = pbVar6[lVar21] == 0;
LAB_001051af:
      pbVar22 = pbVar6 + sVar7;
      bVar36 = true;
      local_a0 = 0;
      local_7c = 0;
      bVar23 = false;
      bVar28 = false;
      bVar24 = false;
      bVar29 = false;
      bVar25 = false;
      bVar10 = false;
      bVar9 = false;
      local_a4 = 0;
      pbVar16 = pbVar6;
      iVar30 = iVar13;
LAB_00105205:
      do {
        if (pbVar16 == pbVar22) goto LAB_001058b9;
        if (pbVar16 == pbVar6) {
          if (((bVar38 - 0x21 < 0x40) &&
              ((0x94000000a0000a77U >> ((ulong)(bVar38 - 0x21) & 0x3f) & 1) != 0)) ||
             (bVar38 - 0x7b < 3)) {
            iVar13 = 1;
            iVar30 = 1;
          }
          uVar35 = (uint)bVar38;
          if ((uVar35 == 0x3f) || (uVar35 == 0x3a)) {
            if (bVar37) {
              iVar13 = 1;
            }
            iVar30 = 1;
          }
          if (bVar38 == 0x2d && bVar37) {
            iVar13 = 1;
            iVar30 = 1;
          }
          uVar33 = (ulong)uVar35;
        }
        else {
          bVar32 = *pbVar16;
          uVar33 = (ulong)bVar32;
          uVar35 = bVar32 - 0x3f;
          if (((uVar35 < 0x3f) && ((0x5000000050000001U >> ((ulong)uVar35 & 0x3f) & 1) != 0)) ||
             (bVar32 == 0x2c)) {
            iVar30 = 1;
          }
          iVar26 = iVar12;
          if (!bVar37) {
            iVar26 = iVar13;
          }
          if (bVar32 != 0x3a) {
            iVar26 = iVar13;
          }
          iVar13 = iVar26;
          if ((bool)(bVar36 & bVar32 == 0x23)) {
            iVar30 = 1;
            iVar13 = iVar14;
          }
          if (bVar32 == 0x3a) {
            iVar30 = 1;
          }
        }
        bVar32 = (byte)uVar33;
        uVar35 = (uint)uVar33;
        iVar26 = iVar12;
        if (bVar32 == 10) {
LAB_001052d3:
          lStack_b0 = 1;
LAB_001052d7:
          if (pbVar16 == pbVar6) {
            bVar28 = true;
          }
          if (pbVar16 + lStack_b0 == pbVar22) {
            bVar29 = true;
          }
          local_a4 = iVar14;
          local_a0 = iVar26;
          if (bVar9) {
            bVar10 = true;
          }
LAB_00105306:
          bVar9 = false;
          if ((bVar32 < 0x21) && (bVar36 = true, (0x100002600U >> (uVar33 & 0x3f) & 1) != 0)) {
LAB_00105322:
            lStack_b0 = 1;
          }
          else {
            if (uVar35 == 0xe2) {
              bVar36 = false;
              goto LAB_00105500;
            }
            if (uVar35 == 0xc2) {
              bVar36 = pbVar16[1] == 0x85;
            }
            else {
              bVar36 = bVar32 == 0;
              if (-1 < (char)bVar32) goto LAB_00105322;
              if ((uVar35 & 0xe0) != 0xc0) {
                if ((uVar35 & 0xf0) == 0xe0) goto LAB_00105500;
                lStack_b0 = (ulong)((uVar35 & 0xf8) == 0xf0) << 2;
                goto LAB_00105504;
              }
            }
LAB_001054cc:
            bVar9 = false;
            lStack_b0 = 2;
          }
        }
        else {
          if (0x5e < (byte)(bVar32 - 0x20)) {
            if (bVar32 == 0xc2) {
              if (pbVar16[1] < 0xa0) goto LAB_0010547c;
LAB_00105381:
              if (emitter->unicode != 0) goto LAB_00105480;
            }
            else {
              if ((byte)(bVar32 + 0x3d) < 0x2a) goto LAB_00105381;
              if (bVar32 != 0xef) {
                if ((uVar35 != 0xee) && ((uVar35 != 0xed || (0x9f < pbVar16[1]))))
                goto LAB_0010547c;
                goto LAB_00105381;
              }
              if (pbVar16[1] == 0xbf) {
                if ((pbVar16[2] & 0xfe) != 0xbe) goto LAB_00105381;
              }
              else if ((pbVar16[1] != 0xbb) || (pbVar16[2] != 0xbf)) goto LAB_00105381;
            }
LAB_0010547c:
            local_7c = iVar14;
          }
LAB_00105480:
          if ((bVar32 == 10) || (uVar35 == 0xd)) {
LAB_0010565b:
            if ((bVar32 == 10) || (uVar35 == 0xd)) goto LAB_001052d3;
            local_a0 = iVar26;
            if (uVar35 != 0x20) {
              local_a4 = 0;
              goto LAB_00105306;
            }
            if (pbVar16 == pbVar6) {
              bVar23 = true;
            }
            if (pbVar16 + 1 == pbVar22) {
              bVar24 = true;
            }
            if (local_a4 != 0) {
              bVar25 = true;
            }
            local_a4 = 0;
            bVar36 = true;
            bVar9 = true;
            goto LAB_00105322;
          }
          if (uVar35 != 0xe2) {
            iVar26 = local_a0;
            if (uVar35 != 0xc2) goto LAB_0010565b;
            bVar36 = false;
            lStack_b0 = 2;
            iVar26 = iVar12;
            if (pbVar16[1] == 0x85) goto LAB_001052d7;
            local_a4 = 0;
            goto LAB_001054cc;
          }
          bVar36 = false;
          local_a4 = 0;
LAB_00105500:
          bVar9 = false;
          lStack_b0 = 3;
        }
LAB_00105504:
        pbVar16 = pbVar16 + lStack_b0;
        if (pbVar16 != pbVar22) {
          bVar32 = *pbVar16;
          if ((char)bVar32 < '\0') {
            if ((bVar32 & 0xe0) == 0xc0) {
              bVar34 = pbVar16[2];
              if (((ulong)bVar34 < 0x21) &&
                 (bVar37 = true, (0x100002600U >> ((ulong)bVar34 & 0x3f) & 1) != 0))
              goto LAB_00105205;
              if (bVar34 != 0xc2) goto LAB_001056df;
              bVar34 = pbVar16[3];
LAB_00105648:
              bVar37 = true;
              if (bVar34 == 0x85) goto LAB_00105205;
LAB_00105712:
              lStack_b0 = 2;
              if ((bVar32 & 0xe0) == 0xc0) goto LAB_0010574e;
            }
            else {
              lVar21 = (ulong)((bVar32 & 0xf8) == 0xf0) << 2;
              if ((bVar32 & 0xf0) == 0xe0) {
                lVar21 = 3;
              }
              bVar34 = pbVar16[lVar21];
              if (((ulong)bVar34 < 0x21) &&
                 (bVar37 = true, (0x100002600U >> ((ulong)bVar34 & 0x3f) & 1) != 0))
              goto LAB_00105205;
              if (bVar34 == 0xc2) {
                lVar21 = (ulong)((bVar32 & 0xf8) == 0xf0) * 4 + 1;
                if ((bVar32 & 0xf0) == 0xe0) {
                  lVar21 = 4;
                }
                bVar34 = pbVar16[lVar21];
                goto LAB_00105648;
              }
LAB_001056df:
              if (bVar34 != 0xe2) {
                lStack_b0 = 1;
                if (-1 < (char)bVar32) goto LAB_0010574e;
                goto LAB_00105712;
              }
              if (-1 < (char)bVar32) goto LAB_00105558;
              if ((bVar32 & 0xe0) == 0xc0) {
                lStack_b0 = 2;
                goto LAB_0010574e;
              }
            }
            lStack_b0 = 3;
            if ((bVar32 & 0xf0) != 0xe0) {
              lStack_b0 = (ulong)((bVar32 & 0xf8) == 0xf0) << 2;
            }
          }
          else {
            bVar34 = pbVar16[1];
            if (((ulong)bVar34 < 0x21) &&
               (bVar37 = true, (0x100002600U >> ((ulong)bVar34 & 0x3f) & 1) != 0))
            goto LAB_00105205;
            if (bVar34 == 0xc2) {
              bVar37 = true;
              lStack_b0 = 1;
              if (pbVar16[2] == 0x85) goto LAB_00105205;
            }
            else {
              lStack_b0 = 1;
              if (bVar34 == 0xe2) {
LAB_00105558:
                lStack_b0 = 1;
              }
            }
          }
LAB_0010574e:
          if (pbVar16[lStack_b0] == 0xe2) {
            if ((char)bVar32 < '\0') {
              if ((bVar32 & 0xe0) != 0xc0) goto LAB_00105820;
              lStack_b0 = 2;
            }
            else {
              lStack_b0 = 1;
            }
          }
          else {
            lStack_b0 = 1;
            if (((char)bVar32 < '\0') && (lStack_b0 = 2, (bVar32 & 0xe0) != 0xc0)) {
LAB_00105820:
              lStack_b0 = 3;
              if ((bVar32 & 0xf0) != 0xe0) {
                lStack_b0 = (ulong)((bVar32 & 0xf8) == 0xf0) << 2;
              }
            }
          }
          bVar37 = pbVar16[lStack_b0] == 0;
        }
      } while( true );
    }
    (emitter->scalar_data).multiline = 0;
    (emitter->scalar_data).flow_plain_allowed = 0;
    (emitter->scalar_data).block_plain_allowed = 1;
    (emitter->scalar_data).single_quoted_allowed = 1;
    piVar17 = piVar3;
    goto LAB_00105954;
  case YAML_SEQUENCE_START_EVENT:
  case YAML_MAPPING_START_EVENT:
    pyVar19 = (pyVar31->data).scalar.anchor;
    if ((pyVar19 != (yaml_char_t *)0x0) &&
       (iVar14 = yaml_emitter_analyze_anchor(emitter,pyVar19,0), iVar14 == 0)) {
      return 0;
    }
    pyVar19 = (pyVar31->data).scalar.tag;
    if ((pyVar19 != (yaml_char_t *)0x0) &&
       ((emitter->canonical != 0 || ((pyVar31->data).sequence_start.implicit == 0)))) {
      iVar14 = yaml_emitter_analyze_tag(emitter,pyVar19);
      goto LAB_00104e39;
    }
  }
  goto switchD_00104dee_caseD_8;
LAB_001058b9:
  (emitter->scalar_data).multiline = local_a0;
  (emitter->scalar_data).flow_plain_allowed = 1;
  (emitter->scalar_data).block_plain_allowed = 1;
  (emitter->scalar_data).single_quoted_allowed = 1;
  (emitter->scalar_data).block_allowed = 1;
  if ((((bVar23) || (bVar28)) || (bVar24)) || (bVar29)) {
    *piVar1 = 0;
    *piVar2 = 0;
    if (bVar24) {
      *piVar3 = 0;
    }
  }
  if (bVar25) {
    (emitter->scalar_data).flow_plain_allowed = 0;
    (emitter->scalar_data).block_plain_allowed = 0;
    (emitter->scalar_data).single_quoted_allowed = 0;
  }
  if (bVar10 || local_7c != 0) {
    (emitter->scalar_data).flow_plain_allowed = 0;
    (emitter->scalar_data).block_plain_allowed = 0;
    (emitter->scalar_data).single_quoted_allowed = 0;
    (emitter->scalar_data).block_allowed = 0;
  }
  if (local_a0 != 0) {
    *piVar1 = 0;
    *piVar2 = 0;
  }
  if (iVar30 != 0) {
    *piVar1 = 0;
  }
  piVar17 = piVar2;
  if (iVar13 != 0) {
LAB_00105954:
    *piVar17 = 0;
  }
switchD_00104dee_caseD_8:
  if (YAML_EMIT_END_STATE < emitter->state) {
    return 0;
  }
  pyVar31 = (emitter->events).head;
  switch(emitter->state) {
  case YAML_EMIT_STREAM_START_STATE:
    if (pyVar31->type != YAML_STREAM_START_EVENT) {
      emitter->error = YAML_EMITTER_ERROR;
      pcVar20 = "expected STREAM-START";
      goto LAB_00105d3d;
    }
    yVar15 = emitter->encoding;
    if (yVar15 == YAML_ANY_ENCODING) {
      yVar15 = (pyVar31->data).stream_start.encoding;
      yVar15 = yVar15 + (yVar15 == YAML_ANY_ENCODING);
      emitter->encoding = yVar15;
    }
    iVar12 = emitter->best_indent;
    if (iVar12 - 10U < 0xfffffff8) {
      emitter->best_indent = 2;
      iVar12 = 2;
    }
    if (emitter->best_width < 0) {
      iVar14 = 0x7fffffff;
LAB_00105bce:
      emitter->best_width = iVar14;
    }
    else {
      iVar14 = 0x50;
      if ((uint)emitter->best_width <= (uint)(iVar12 * 2)) goto LAB_00105bce;
    }
    if (emitter->line_break == YAML_ANY_BREAK) {
      emitter->line_break = YAML_LN_BREAK;
    }
    emitter->indent = -1;
    emitter->line = 0;
    emitter->column = 0;
    emitter->whitespace = 1;
    emitter->indention = 1;
    if (yVar15 != YAML_UTF8_ENCODING) {
      pyVar19 = (emitter->buffer).pointer;
      if ((emitter->buffer).end <= pyVar19 + 5) {
        iVar12 = yaml_emitter_flush(emitter);
        if (iVar12 == 0) {
          return 0;
        }
        pyVar19 = (emitter->buffer).pointer;
      }
      (emitter->buffer).pointer = pyVar19 + 1;
      *pyVar19 = 0xef;
      pyVar19 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar19 + 1;
      *pyVar19 = 0xbb;
      pyVar19 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar19 + 1;
      *pyVar19 = 0xbf;
    }
    emitter->state = YAML_EMIT_FIRST_DOCUMENT_START_STATE;
    goto LAB_00105bad;
  case YAML_EMIT_FIRST_DOCUMENT_START_STATE:
    break;
  case YAML_EMIT_DOCUMENT_START_STATE:
    iVar12 = 0;
    break;
  case YAML_EMIT_DOCUMENT_CONTENT_STATE:
    pyVar18 = *top;
    if (pyVar18 == *end) {
      iVar12 = yaml_stack_extend(&(emitter->states).start,top,end);
      if (iVar12 == 0) {
        emitter->error = YAML_MEMORY_ERROR;
        return 0;
      }
      pyVar18 = *top;
    }
    (emitter->states).top = pyVar18 + 1;
    *pyVar18 = YAML_EMIT_DOCUMENT_END_STATE;
    iVar12 = yaml_emitter_emit_node(emitter,pyVar31,1,0,0,0);
    goto LAB_00105ba0;
  case YAML_EMIT_DOCUMENT_END_STATE:
    if (pyVar31->type != YAML_DOCUMENT_END_EVENT) {
      emitter->error = YAML_EMITTER_ERROR;
      pcVar20 = "expected DOCUMENT-END";
      goto LAB_00105d3d;
    }
    iVar12 = yaml_emitter_write_indent(emitter);
    if (iVar12 == 0) {
      return 0;
    }
    if ((pyVar31->data).stream_start.encoding == YAML_ANY_ENCODING) {
      iVar12 = yaml_emitter_write_indicator(emitter,"...",1,0,0);
      if (iVar12 == 0) {
        return 0;
      }
      iVar12 = yaml_emitter_write_indent(emitter);
      if (iVar12 == 0) {
        return 0;
      }
    }
    iVar12 = yaml_emitter_flush(emitter);
    if (iVar12 == 0) {
      return 0;
    }
    emitter->state = YAML_EMIT_DOCUMENT_START_STATE;
    while (pyVar8 = (emitter->tag_directives).top, (emitter->tag_directives).start != pyVar8) {
      (emitter->tag_directives).top = pyVar8 + -1;
      pyVar19 = pyVar8[-1].prefix;
      yaml_free(pyVar8[-1].handle);
      yaml_free(pyVar19);
    }
    goto LAB_00105bad;
  case YAML_EMIT_FLOW_SEQUENCE_FIRST_ITEM_STATE:
    goto LAB_00105b7d;
  case YAML_EMIT_FLOW_SEQUENCE_ITEM_STATE:
    iVar12 = 0;
LAB_00105b7d:
    iVar12 = yaml_emitter_emit_flow_sequence_item(emitter,pyVar31,iVar12);
    goto LAB_00105ba0;
  case YAML_EMIT_FLOW_MAPPING_FIRST_KEY_STATE:
    goto LAB_00105b9b;
  case YAML_EMIT_FLOW_MAPPING_KEY_STATE:
    iVar12 = 0;
LAB_00105b9b:
    iVar12 = yaml_emitter_emit_flow_mapping_key(emitter,pyVar31,iVar12);
    goto LAB_00105ba0;
  case YAML_EMIT_FLOW_MAPPING_SIMPLE_VALUE_STATE:
    goto LAB_00105b8c;
  case YAML_EMIT_FLOW_MAPPING_VALUE_STATE:
    iVar12 = 0;
LAB_00105b8c:
    iVar12 = yaml_emitter_emit_flow_mapping_value(emitter,pyVar31,iVar12);
    goto LAB_00105ba0;
  case YAML_EMIT_BLOCK_SEQUENCE_FIRST_ITEM_STATE:
    goto LAB_00105ab9;
  case YAML_EMIT_BLOCK_SEQUENCE_ITEM_STATE:
    iVar12 = 0;
LAB_00105ab9:
    iVar12 = yaml_emitter_emit_block_sequence_item(emitter,pyVar31,iVar12);
    goto LAB_00105ba0;
  case YAML_EMIT_BLOCK_MAPPING_FIRST_KEY_STATE:
    goto LAB_00105b6e;
  case YAML_EMIT_BLOCK_MAPPING_KEY_STATE:
    iVar12 = 0;
LAB_00105b6e:
    iVar12 = yaml_emitter_emit_block_mapping_key(emitter,pyVar31,iVar12);
    goto LAB_00105ba0;
  case YAML_EMIT_BLOCK_MAPPING_SIMPLE_VALUE_STATE:
    goto LAB_00105ae2;
  case YAML_EMIT_BLOCK_MAPPING_VALUE_STATE:
    iVar12 = 0;
LAB_00105ae2:
    iVar12 = yaml_emitter_emit_block_mapping_value(emitter,pyVar31,iVar12);
    goto LAB_00105ba0;
  case YAML_EMIT_END_STATE:
    emitter->error = YAML_EMITTER_ERROR;
    pcVar20 = "expected nothing after STREAM-END";
LAB_00105d3d:
    emitter->problem = pcVar20;
    return 0;
  }
  iVar12 = yaml_emitter_emit_document_start(emitter,pyVar31,iVar12);
LAB_00105ba0:
  if (iVar12 == 0) {
    return 0;
  }
LAB_00105bad:
  pyVar31 = (emitter->events).head;
  (emitter->events).head = pyVar31 + 1;
  yaml_event_delete(pyVar31);
  goto LAB_00104d39;
}

Assistant:

YAML_DECLARE(int)
yaml_emitter_emit(yaml_emitter_t *emitter, yaml_event_t *event)
{
    if (!ENQUEUE(emitter, emitter->events, *event)) {
        yaml_event_delete(event);
        return 0;
    }

    while (!yaml_emitter_need_more_events(emitter)) {
        if (!yaml_emitter_analyze_event(emitter, emitter->events.head))
            return 0;
        if (!yaml_emitter_state_machine(emitter, emitter->events.head))
            return 0;
        yaml_event_delete(&DEQUEUE(emitter, emitter->events));
    }

    return 1;
}